

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::populateFixedArgs
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens,
          ConfigData *config)

{
  _Rb_tree_header *p_Var1;
  value_type *__x;
  pointer pTVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  int iVar6;
  
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar2 = (tokens->
           super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((tokens->
      super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>)
      ._M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    p_Var1 = &(this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header;
    iVar6 = 1;
    uVar5 = 0;
    do {
      __x = pTVar2 + uVar5;
      p_Var4 = (this->m_positionalArgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      if (p_Var4 == (_Base_ptr)0x0) {
LAB_001561fe:
        std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::
        push_back(__return_storage_ptr__,__x);
      }
      else {
        do {
          if (iVar6 <= (int)*(size_t *)(p_Var4 + 1)) {
            p_Var3 = p_Var4;
          }
          p_Var4 = (&p_Var4->_M_left)[(int)*(size_t *)(p_Var4 + 1) < iVar6];
        } while (p_Var4 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var3 == p_Var1) ||
           (iVar6 < (int)((_Rb_tree_header *)p_Var3)->_M_node_count)) goto LAB_001561fe;
        (**(code **)(**(long **)((long)p_Var3 + 0x28) + 0x10))
                  (*(long **)((long)p_Var3 + 0x28),config,&__x->data);
      }
      iVar6 = iVar6 + (uint)(__x->type == Positional);
      uVar5 = uVar5 + 1;
      pTVar2 = (tokens->
               super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)(((long)(tokens->
                                    super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 3)
                            * -0x3333333333333333));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> populateFixedArgs( std::vector<Parser::Token> const& tokens, ConfigT& config ) const {
            std::vector<Parser::Token> unusedTokens;
            int position = 1;
            for( std::size_t i = 0; i < tokens.size(); ++i ) {
                Parser::Token const& token = tokens[i];
                typename std::map<int, Arg>::const_iterator it = m_positionalArgs.find( position );
                if( it != m_positionalArgs.end() )
                    it->second.boundField.set( config, token.data );
                else
                    unusedTokens.push_back( token );
                if( token.type == Parser::Token::Positional )
                    position++;
            }
            return unusedTokens;
        }